

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O1

void FillTables(void)

{
  kTinyDenseCounts[0x40] = '\x13';
  kTinyDenseCounts[0] = '\0';
  kTinyDenseCounts[1] = '\0';
  kTinyDenseCounts[2] = '\x02';
  kTinyDenseCounts[3] = '\x03';
  kTinyDenseCounts[4] = '\x03';
  kTinyDenseCounts[5] = '\x05';
  kTinyDenseCounts[6] = '\x06';
  kTinyDenseCounts[7] = '\x06';
  kTinyDenseCounts[8] = '\x06';
  kTinyDenseCounts[9] = '\a';
  kTinyDenseCounts[10] = '\t';
  kTinyDenseCounts[0xb] = '\n';
  kTinyDenseCounts[0xc] = '\n';
  kTinyDenseCounts[0xd] = '\n';
  kTinyDenseCounts[0xe] = '\f';
  kTinyDenseCounts[0xf] = '\x0e';
  kTinyDenseCounts[0x10] = '\r';
  kTinyDenseCounts[0x11] = '\x0e';
  kTinyDenseCounts[0x12] = '\f';
  kTinyDenseCounts[0x13] = '\f';
  kTinyDenseCounts[0x14] = '\x0f';
  kTinyDenseCounts[0x15] = '\x10';
  kTinyDenseCounts[0x16] = '\x15';
  kTinyDenseCounts[0x17] = '\x0e';
  kTinyDenseCounts[0x18] = '\x0e';
  kTinyDenseCounts[0x19] = '\r';
  kTinyDenseCounts[0x1a] = '\x12';
  kTinyDenseCounts[0x1b] = '\x15';
  kTinyDenseCounts[0x1c] = '\x16';
  kTinyDenseCounts[0x1d] = '\x15';
  kTinyDenseCounts[0x1e] = '\r';
  kTinyDenseCounts[0x1f] = '\x16';
  kTinyDenseCounts[0x20] = '\r';
  kTinyDenseCounts[0x21] = '\x18';
  kTinyDenseCounts[0x22] = '\x0e';
  kTinyDenseCounts[0x23] = '\x11';
  kTinyDenseCounts[0x24] = '\x10';
  kTinyDenseCounts[0x25] = '\x18';
  kTinyDenseCounts[0x26] = '\x1e';
  kTinyDenseCounts[0x27] = '\x1a';
  kTinyDenseCounts[0x28] = '\x18';
  kTinyDenseCounts[0x29] = '\x12';
  kTinyDenseCounts[0x2a] = '\x0f';
  kTinyDenseCounts[0x2b] = '\x0f';
  kTinyDenseCounts[0x2c] = '\x18';
  kTinyDenseCounts[0x2d] = '\x12';
  kTinyDenseCounts[0x2e] = '\x15';
  kTinyDenseCounts[0x2f] = '\x11';
  kTinyDenseCounts[0x30] = '\x0e';
  kTinyDenseCounts[0x31] = '\x10';
  kTinyDenseCounts[0x32] = '\x15';
  kTinyDenseCounts[0x33] = '\x12';
  kTinyDenseCounts[0x34] = '\x11';
  kTinyDenseCounts[0x35] = '\x16';
  kTinyDenseCounts[0x36] = '\x19';
  kTinyDenseCounts[0x37] = '\x14';
  kTinyDenseCounts[0x38] = '\x11';
  kTinyDenseCounts[0x39] = '\x12';
  kTinyDenseCounts[0x3a] = '\x15';
  kTinyDenseCounts[0x3b] = '\x12';
  kTinyDenseCounts[0x3c] = '\x17';
  kTinyDenseCounts[0x3d] = '\x14';
  kTinyDenseCounts[0x3e] = '\x13';
  kTinyDenseCounts[0x3f] = '\x17';
  kTinyDenseSeeds[0] = 0;
  kTinyDenseSeeds[1] = 0;
  kTinyDenseSeeds[2] = 0x3186;
  kTinyDenseSeeds[3] = 0x7a0f;
  kTinyDenseSeeds[4] = 0x5eb6;
  kTinyDenseSeeds[5] = 0x1aae;
  kTinyDenseSeeds[6] = 0x2847;
  kTinyDenseSeeds[7] = 0x4a1f;
  kTinyDenseSeeds[8] = 0xb6fc;
  kTinyDenseSeeds[9] = 0x378;
  kTinyDenseSeeds[10] = 0x96c6;
  kTinyDenseSeeds[0xb] = 0xf924;
  kTinyDenseSeeds[0xc] = 0x2f8a;
  kTinyDenseSeeds[0xd] = 0x5f7c;
  kTinyDenseSeeds[0xe] = 0xda99;
  kTinyDenseSeeds[0xf] = 0x3355;
  kTinyDenseSeeds[0x10] = 0xd0e0;
  kTinyDenseSeeds[0x11] = 0xd8be;
  kTinyDenseSeeds[0x12] = 0x6f50;
  kTinyDenseSeeds[0x13] = 0x6a4e;
  kTinyDenseSeeds[0x14] = 0xbfdd;
  kTinyDenseSeeds[0x15] = 0xed41;
  kTinyDenseSeeds[0x16] = 0xf263;
  kTinyDenseSeeds[0x17] = 0xe9a3;
  kTinyDenseSeeds[0x18] = 0xbec;
  kTinyDenseSeeds[0x19] = 0x8358;
  kTinyDenseSeeds[0x1a] = 0x8bd1;
  kTinyDenseSeeds[0x1b] = 0x2012;
  kTinyDenseSeeds[0x1c] = 0x7fa2;
  kTinyDenseSeeds[0x1d] = 0x8d3b;
  kTinyDenseSeeds[0x1e] = 0x2a43;
  kTinyDenseSeeds[0x1f] = 0xcdf7;
  kTinyDenseSeeds[0x20] = 0x25dc;
  kTinyDenseSeeds[0x21] = 0x6667;
  kTinyDenseSeeds[0x22] = 0x8152;
  kTinyDenseSeeds[0x23] = 0x852c;
  kTinyDenseSeeds[0x24] = 0x495b;
  kTinyDenseSeeds[0x25] = 0xee80;
  kTinyDenseSeeds[0x26] = 0x1196;
  kTinyDenseSeeds[0x27] = 0x1e6a;
  kTinyDenseSeeds[0x28] = 0x8e2d;
  kTinyDenseSeeds[0x29] = 0xcfab;
  kTinyDenseSeeds[0x2a] = 0x8f09;
  kTinyDenseSeeds[0x2b] = 0x3e89;
  kTinyDenseSeeds[0x2c] = 0xec3c;
  kTinyDenseSeeds[0x2d] = 0x7b95;
  kTinyDenseSeeds[0x2e] = 0x94c6;
  kTinyDenseSeeds[0x2f] = 0x7d1b;
  kTinyDenseSeeds[0x30] = 0x3c8;
  kTinyDenseSeeds[0x31] = 0xe9f8;
  kTinyDenseSeeds[0x32] = 0x6cab;
  kTinyDenseSeeds[0x33] = 0x27d1;
  kTinyDenseSeeds[0x34] = 0xfcf3;
  kTinyDenseSeeds[0x35] = 0xa224;
  kTinyDenseSeeds[0x36] = 0xad5d;
  kTinyDenseSeeds[0x37] = 0xa263;
  kTinyDenseSeeds[0x38] = 0xcb99;
  kTinyDenseSeeds[0x39] = 0x5c2a;
  kTinyDenseSeeds[0x3a] = 0x139;
  kTinyDenseSeeds[0x3b] = 0x95ee;
  kTinyDenseSeeds[0x3c] = 0xbda5;
  kTinyDenseSeeds[0x3d] = 0xaf44;
  kTinyDenseSeeds[0x3e] = 0xab0d;
  kTinyDenseSeeds[0x3f] = 0x20cc;
  kTinyDenseSeeds[0x40] = 0x76e;
  memcpy(kSmallDenseSeeds,wirehair::kSmallDenseSeeds,0x7bf);
  memcpy(kSmallPeelSeeds,wirehair::kSmallPeelSeeds,0x800);
  return;
}

Assistant:

void FillTables()
{
    memcpy(kTinyDenseCounts, wirehair::kTinyDenseCounts, sizeof(kTinyDenseCounts));
    memcpy(kTinyDenseSeeds, wirehair::kTinyDenseSeeds, sizeof(kTinyDenseSeeds));
    memcpy(kSmallDenseSeeds, wirehair::kSmallDenseSeeds, sizeof(kSmallDenseSeeds));
    memcpy(kSmallPeelSeeds, wirehair::kSmallPeelSeeds, sizeof(kSmallPeelSeeds));
}